

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtl_json_writer.c
# Opt level: O0

void dtl_json_writer_createWithFile(dtl_json_writer_t *self,FILE *fh)

{
  FILE *fh_local;
  dtl_json_writer_t *self_local;
  
  if (self != (dtl_json_writer_t *)0x0) {
    self->outputType = '\x01';
    self->indentWidth = 0;
    self->currentIndent = 0;
    self->indentArray = (adt_bytearray_t *)0x0;
    self->destStr = (adt_str_t *)0x0;
    self->destFile = fh;
    self->newLineStr = "\n";
    self->sortKeys = false;
  }
  return;
}

Assistant:

static void dtl_json_writer_createWithFile(dtl_json_writer_t *self, FILE *fh)
{
   if (self != 0)
   {
      self->outputType = OUTPUT_TYPE_FILE;
      self->indentWidth = 0;
      self->currentIndent = 0;
      self->indentArray = (adt_bytearray_t*) 0;
      self->destStr = (adt_str_t*) 0;
      self->destFile = fh;
      self->newLineStr = "\n";
      self->sortKeys = false;
   }
}